

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

CTcCodeLabel * __thiscall CTcCodeStream::alloc_label(CTcCodeStream *this)

{
  long in_RDI;
  CTcCodeLabel *ret;
  CTcPrsMem *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  CTcCodeLabel *local_10;
  
  if (*(long *)(in_RDI + 0x70) == 0) {
    local_10 = (CTcCodeLabel *)
               CTcCSPrsAllocObj::operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    CTcCodeLabel::CTcCodeLabel(local_10);
    if (local_10 == (CTcCodeLabel *)0x0) {
      err_throw(0);
    }
  }
  else {
    local_10 = *(CTcCodeLabel **)(in_RDI + 0x70);
    *(undefined8 *)(in_RDI + 0x70) = **(undefined8 **)(in_RDI + 0x70);
  }
  local_10->nxt = *(CTcCodeLabel **)(in_RDI + 0x68);
  *(CTcCodeLabel **)(in_RDI + 0x68) = local_10;
  return local_10;
}

Assistant:

CTcCodeLabel *CTcCodeStream::alloc_label()
{
    CTcCodeLabel *ret;
    
    /* if there's anything in the free list, use it */
    if (free_lbl_ != 0)
    {
        /* take the first one off the free list */
        ret = free_lbl_;

        /* unlink it from the list */
        free_lbl_ = free_lbl_->nxt;
    }
    else
    {
        /* allocate a new label */
        ret = new (allocator_) CTcCodeLabel;

        /* throw an error if allocation failed */
        if (ret == 0)
            err_throw(TCERR_CODEGEN_NO_MEM);
    }

    /* add the label to the active list */
    ret->nxt = active_lbl_;
    active_lbl_ = ret;

    /* return the allocated label */
    return ret;
}